

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O3

void __thiscall
checkqueue_tests::test_CheckQueue_FrozenCleanup::test_method(test_CheckQueue_FrozenCleanup *this)

{
  bool bVar1;
  int iVar2;
  CCheckQueue<FakeCheckCheckCompletion> *this_00;
  iterator in_R8;
  iterator in_R9;
  uint uVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  thread t0;
  __single_object queue;
  unique_lock<std::mutex> l;
  check_type cVar4;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  long local_50;
  _Head_base<0UL,_CCheckQueue<FrozenCleanupCheck>_*,_false> local_48;
  unique_lock<std::mutex> local_40;
  undefined1 *local_30;
  char **local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CCheckQueue<FakeCheckCheckCompletion> *)operator_new(0x100);
  CCheckQueue<FrozenCleanupCheck>::CCheckQueue((CCheckQueue<FrozenCleanupCheck> *)this_00,0x80,3);
  local_50 = 0;
  local_48._M_head_impl = this_00;
  local_40._M_device = (mutex_type *)operator_new(0x10);
  ((local_40._M_device)->super___mutex_base)._M_mutex.__align = (long)&PTR___State_0138a310;
  *(_Head_base<0UL,_CCheckQueue<FrozenCleanupCheck>_*,_false> **)
   ((long)&((local_40._M_device)->super___mutex_base)._M_mutex + 8) = &local_48;
  std::thread::_M_start_thread(&local_50,&local_40,0);
  if (local_40._M_device != (mutex_type *)0x0) {
    (**(code **)(((local_40._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  local_40._M_device = &FrozenCleanupCheck::m;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  while (FrozenCleanupCheck::nFrozen.super___atomic_base<unsigned_long>._M_i != 1) {
    std::condition_variable::wait((unique_lock *)FrozenCleanupCheck::cv);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  uVar3 = 0;
  do {
    iVar2 = pthread_mutex_trylock((pthread_mutex_t *)&(local_48._M_head_impl)->m_control_mutex);
    if (iVar2 == 0) break;
    bVar1 = uVar3 < 99;
    uVar3 = uVar3 + 1;
  } while (bVar1);
  local_40._M_device = &FrozenCleanupCheck::m;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  LOCK();
  FrozenCleanupCheck::nFrozen.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  std::condition_variable::notify_one();
  std::thread::join();
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x161;
  file.m_begin = (iterator)&local_60;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
  local_88.m_message.px = (element_type *)0x0;
  local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_28 = &local_98;
  local_98 = "!fails";
  local_90 = "";
  local_40._M_owns = false;
  local_40._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
  local_30 = boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_a0 = "";
  local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar2 != 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_88,(lazy_ostream *)&local_40,2,0,WARN,_cVar4,(size_t)&local_a8,0x161);
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  if (local_50 != 0) {
    std::terminate();
  }
  std::
  unique_ptr<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
  ::~unique_ptr((unique_ptr<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
                 *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_FrozenCleanup)
{
    auto queue = std::make_unique<FrozenCleanup_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    bool fails = false;
    std::thread t0([&]() {
        CCheckQueueControl<FrozenCleanupCheck> control(queue.get());
        std::vector<FrozenCleanupCheck> vChecks(1);
        control.Add(std::move(vChecks));
        bool waitResult = control.Wait(); // Hangs here
        assert(waitResult);
    });
    {
        std::unique_lock<std::mutex> l(FrozenCleanupCheck::m);
        // Wait until the queue has finished all jobs and frozen
        FrozenCleanupCheck::cv.wait(l, [](){return FrozenCleanupCheck::nFrozen == 1;});
    }
    // Try to get control of the queue a bunch of times
    for (auto x = 0; x < 100 && !fails; ++x) {
        fails = queue->m_control_mutex.try_lock();
    }
    {
        // Unfreeze (we need lock n case of spurious wakeup)
        std::unique_lock<std::mutex> l(FrozenCleanupCheck::m);
        FrozenCleanupCheck::nFrozen = 0;
    }
    // Awaken frozen destructor
    FrozenCleanupCheck::cv.notify_one();
    // Wait for control to finish
    t0.join();
    BOOST_REQUIRE(!fails);
}